

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O3

void __thiscall
soul::AST::StructMemberRef::StructMemberRef
          (StructMemberRef *this,Context *c,Expression *o,StructurePtr *s,string *member)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  SourceCodeText *pSVar3;
  Structure *pSVar4;
  pointer pcVar5;
  Scope *pSVar6;
  undefined8 uVar7;
  
  (this->super_Expression).super_Statement.super_ASTObject.objectType = StructMemberRef;
  pSVar3 = (c->location).sourceCode.object;
  (this->super_Expression).super_Statement.super_ASTObject.context.location.sourceCode.object =
       pSVar3;
  if (pSVar3 != (SourceCodeText *)0x0) {
    (pSVar3->super_RefCountedObject).refCount = (pSVar3->super_RefCountedObject).refCount + 1;
  }
  pSVar6 = c->parentScope;
  (this->super_Expression).super_Statement.super_ASTObject.context.location.location.data =
       (c->location).location.data;
  (this->super_Expression).super_Statement.super_ASTObject.context.parentScope = pSVar6;
  (this->super_Expression).kind = value;
  (this->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject =
       (_func_int **)&PTR__StructMemberRef_002f8470;
  (this->object).object = o;
  pSVar4 = s->object;
  (this->structure).object = pSVar4;
  if (pSVar4 != (Structure *)0x0) {
    (pSVar4->super_RefCountedObject).refCount = (pSVar4->super_RefCountedObject).refCount + 1;
  }
  paVar1 = &(this->memberName).field_2;
  (this->memberName)._M_dataplus._M_p = (pointer)paVar1;
  pcVar5 = (member->_M_dataplus)._M_p;
  paVar2 = &member->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar2) {
    uVar7 = *(undefined8 *)((long)&member->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->memberName).field_2 + 8) = uVar7;
  }
  else {
    (this->memberName)._M_dataplus._M_p = pcVar5;
    (this->memberName).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->memberName)._M_string_length = member->_M_string_length;
  (member->_M_dataplus)._M_p = (pointer)paVar2;
  member->_M_string_length = 0;
  (member->field_2)._M_local_buf[0] = '\0';
  if (((((this->object).object)->kind & ~unknown) == value) &&
     ((this->structure).object != (Structure *)0x0)) {
    return;
  }
  throwInternalCompilerError
            ("isPossiblyValue (object.get()) && structure != nullptr","StructMemberRef",0x9e4);
}

Assistant:

StructMemberRef (const Context& c, Expression& o, StructurePtr s, std::string member)
            : Expression (ObjectType::StructMemberRef, c, ExpressionKind::value),
              object (o), structure (s), memberName (std::move (member))
        {
            SOUL_ASSERT (isPossiblyValue (object.get()) && structure != nullptr);
        }